

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.h
# Opt level: O0

cmCommand * __thiscall cmUtilitySourceCommand::Clone(cmUtilitySourceCommand *this)

{
  cmCommand *this_00;
  cmUtilitySourceCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmUtilitySourceCommand((cmUtilitySourceCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmUtilitySourceCommand; }